

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

void __thiscall internalJSONNode::preparse(internalJSONNode *this)

{
  JSONNode **ppJVar1;
  ulong uVar2;
  long lVar3;
  
  Fetch(this);
  if ((this->_type & 0xfe) == 4) {
    uVar2 = (ulong)this->Children->mysize;
    if (uVar2 != 0) {
      ppJVar1 = this->Children->array;
      lVar3 = 0;
      do {
        preparse((internalJSONNode *)**(undefined8 **)((long)ppJVar1 + lVar3));
        lVar3 = lVar3 + 8;
      } while (uVar2 << 3 != lVar3);
    }
  }
  return;
}

Assistant:

void internalJSONNode::preparse(void) json_nothrow {
	   Fetch();
	   if (isContainer()){
		  json_foreach(CHILDREN, myrunner){
			 (*myrunner) -> preparse();
		  }
	   }
    }